

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O3

int inflateEnd(z_streamp strm)

{
  int iVar1;
  int iVar2;
  internal_state *piVar3;
  
  iVar1 = inflateStateCheck(strm);
  iVar2 = -2;
  if (iVar1 == 0) {
    piVar3 = strm->state;
    if (*(voidpf *)&piVar3->method != (voidpf)0x0) {
      (*strm->zfree)(strm->opaque,*(voidpf *)&piVar3->method);
      piVar3 = strm->state;
    }
    (*strm->zfree)(strm->opaque,piVar3);
    strm->state = (internal_state *)0x0;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int ZEXPORT inflateEnd(strm)
z_streamp strm;
{
    struct inflate_state FAR *state;
    if (inflateStateCheck(strm))
        return Z_STREAM_ERROR;
    state = (struct inflate_state FAR *)strm->state;
    if (state->window != Z_NULL) ZFREE(strm, state->window);
    ZFREE(strm, strm->state);
    strm->state = Z_NULL;
    Tracev((stderr, "inflate: end\n"));
    return Z_OK;
}